

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void mem_put_varsize(uint8_t *dst,int sz,int val)

{
  int in_EDX;
  undefined4 in_ESI;
  undefined1 *in_RDI;
  
  switch(in_ESI) {
  case 1:
    *in_RDI = (char)in_EDX;
    break;
  case 2:
    mem_put_le16_as_int(in_RDI,in_EDX);
    break;
  case 3:
    mem_put_le24_as_int(in_RDI,in_EDX);
    break;
  case 4:
    mem_put_le32_as_int(in_RDI,in_EDX);
  }
  return;
}

Assistant:

static inline void mem_put_varsize(uint8_t *const dst, const int sz,
                                   const int val) {
  switch (sz) {
    case 1: dst[0] = (uint8_t)(val & 0xff); break;
    case 2: mem_put_le16(dst, val); break;
    case 3: mem_put_le24(dst, val); break;
    case 4: mem_put_le32(dst, val); break;
    default: assert(0 && "Invalid size"); break;
  }
}